

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

void __thiscall
QDialogButtonBoxPrivate::addButton
          (QDialogButtonBoxPrivate *this,QAbstractButton *button,ButtonRole role,
          LayoutRule layoutRule,AddRule addRule)

{
  QPodArrayOps<QAbstractButton*> *this_00;
  void **ppvVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  QObject local_68 [8];
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  QAbstractButton *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QPodArrayOps<QAbstractButton*> *)(this->buttonLists + role);
  local_48 = button;
  QtPrivate::QPodArrayOps<QAbstractButton*>::emplace<QAbstractButton*&>
            (this_00,*(qsizetype *)(this_00 + 0x10),&local_48);
  QList<QAbstractButton_*>::end((QList<QAbstractButton_*> *)this_00);
  if (addRule == Connect) {
    local_48 = (QAbstractButton *)QAbstractButton::clicked;
    local_40 = 0;
    local_58 = handleButtonClicked;
    local_50 = (ImplFn)0x0;
    ppvVar1 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar2 = (undefined4 *)operator_new(0x20);
    *puVar2 = 1;
    *(code **)(puVar2 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QDialogButtonBoxPrivate::*)(),_QtPrivate::List<>,_void>
         ::impl;
    *(code **)(puVar2 + 4) = handleButtonClicked;
    *(undefined8 *)(puVar2 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_60,(void **)button,(QObject *)&local_48,ppvVar1,
               (QSlotObjectBase *)&local_58,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_60);
    local_48 = (QAbstractButton *)QObject::destroyed;
    local_40 = 0;
    local_58 = handleButtonDestroyed;
    local_50 = (ImplFn)0x0;
    ppvVar1 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar2 = (undefined4 *)operator_new(0x20);
    *puVar2 = 1;
    *(code **)(puVar2 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QDialogButtonBoxPrivate::*)(),_QtPrivate::List<>,_void>
         ::impl;
    *(code **)(puVar2 + 4) = handleButtonDestroyed;
    *(undefined8 *)(puVar2 + 6) = 0;
    QObject::connectImpl
              (local_68,(void **)button,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)&local_58,
               (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    QObject::installEventFilter((QObject *)button);
  }
  if (layoutRule == DoLayout) {
    layoutButtons(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::addButton(QAbstractButton *button, QDialogButtonBox::ButtonRole role,
                                        LayoutRule layoutRule, AddRule addRule)
{
    buttonLists[role].append(button);
    switch (addRule) {
    case AddRule::Connect:
        QObjectPrivate::connect(button, &QAbstractButton::clicked,
                               this, &QDialogButtonBoxPrivate::handleButtonClicked);
        QObjectPrivate::connect(button, &QAbstractButton::destroyed,
                               this, &QDialogButtonBoxPrivate::handleButtonDestroyed);
        button->installEventFilter(filter.get());
        break;
    case AddRule::SkipConnect:
        break;
    }

    switch (layoutRule) {
    case LayoutRule::DoLayout:
        layoutButtons();
        break;
    case LayoutRule::SkipLayout:
        break;
    }
}